

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mei.c
# Opt level: O0

ssize_t mei_send_msg(mei *me,uchar *buffer,size_t len)

{
  int iVar1;
  char *pcVar2;
  size_t in_RDX;
  uchar *in_RSI;
  mei *in_RDI;
  ssize_t rc;
  size_t in_stack_ffffffffffffffc0;
  ssize_t sVar3;
  uchar *in_stack_ffffffffffffffc8;
  mei *in_stack_ffffffffffffffd0;
  mei_log_callback p_Var4;
  ssize_t local_8;
  
  if ((in_RDI == (mei *)0x0) || (in_RSI == (uchar *)0x0)) {
    local_8 = -0x16;
  }
  else {
    if (MEI_LOG_LEVEL_ERROR < in_RDI->log_level) {
      if (in_RDI->log_callback == (mei_log_callback)0x0) {
        syslog(7,"call write length = %zu\n",in_RDX);
      }
      else {
        (*in_RDI->log_callback)(false,"call write length = %zu\n",in_RDX);
      }
    }
    mei_dump_hex_buffer(in_RDI,in_RSI,in_RDX);
    local_8 = __mei_write(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                          in_stack_ffffffffffffffc0);
    if (local_8 < 0) {
      iVar1 = __mei_errno_to_state(in_RDI);
      in_RDI->state = iVar1;
      if (in_RDI->log_level != MEI_LOG_LEVEL_QUIET) {
        if (in_RDI->log_callback == (mei_log_callback)0x0) {
          sVar3 = local_8;
          pcVar2 = strerror(-(int)local_8);
          syslog(3,"me: error: write failed with status [%zd]:%s\n",sVar3,pcVar2);
        }
        else {
          p_Var4 = in_RDI->log_callback;
          sVar3 = local_8;
          pcVar2 = strerror(-(int)local_8);
          (*p_Var4)(true,"me: error: write failed with status [%zd]:%s\n",sVar3,pcVar2);
        }
      }
    }
  }
  return local_8;
}

Assistant:

ssize_t mei_send_msg(struct mei *me, const unsigned char *buffer, size_t len)
{
	ssize_t rc;

	if (!me || !buffer)
		return -EINVAL;

	mei_msg(me, "call write length = %zu\n", len);
	mei_dump_hex_buffer(me, buffer, len);

	rc  = __mei_write(me, buffer, len);
	if (rc < 0) {
		me->state = __mei_errno_to_state(me);
		mei_err(me, "write failed with status [%zd]:%s\n",
			rc, strerror(-rc));
		return rc;
	}

	return rc;
}